

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lab_employees.h
# Opt level: O1

void __thiscall lab_employees::lab_employees(lab_employees *this,Person *person,char *Subject)

{
  int *piVar1;
  
  (this->super_Person)._vptr_Person = (_func_int **)&PTR_CheckPassword_00108d98;
  (this->super_Person).gender = true;
  (this->super_Person).id = 0;
  (this->super_Person).access_level = 0;
  (this->super_Person).num_groups = 0;
  piVar1 = (int *)operator_new__(0);
  (this->super_Person).groups = piVar1;
  (this->super_Person)._vptr_Person = (_func_int **)&PTR_CheckPassword_00108d38;
  (this->super_Person).id = person->id;
  (this->super_Person).name = person->name;
  (this->super_Person).surname = person->surname;
  (this->super_Person).gender = person->gender;
  (this->super_Person).age = person->age;
  (this->super_Person).subject = Subject;
  (this->super_Person).access_level = 2;
  return;
}

Assistant:

lab_employees(Person *person,char* Subject) {
        this->id = person->getId();
        this->name = person->getName();
        this->surname = person->getSurname();
        this->gender = person->getGender();
        this->age = person->getAge();
        this->subject = Subject;
        this->access_level = 2;
    }